

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> * __thiscall
ggml_backend_cpu_get_features::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *in_RDI;
  vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *features;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  
  ggml_cpu_init();
  std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::vector
            ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)0x119ecb);
  iVar1 = ggml_cpu_has_sse3();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_ssse3();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_avx();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_avx_vnni();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_avx2();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_f16c();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_fma();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_bmi2();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_avx512();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_avx512_vbmi();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_avx512_vnni();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_avx512_bf16();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_amx_int8();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_neon();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_arm_fma();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_fp16_va();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_matmul_int8();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_sve();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_dotprod();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_get_sve_cnt();
  if (0 < iVar2) {
    if ((ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::sve_cnt_abi_cxx11_ ==
         '\0') &&
       (iVar2 = __cxa_guard_acquire(&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::
                                     operator()()::sve_cnt_abi_cxx11_), iVar2 != 0)) {
      ggml_cpu_get_sve_cnt();
      std::__cxx11::to_string(iVar1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                    sve_cnt_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                           sve_cnt_abi_cxx11_);
    }
    std::__cxx11::string::c_str();
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_sme();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_riscv_v();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar1 = ggml_cpu_has_vsx();
  if (iVar1 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(iVar1,in_stack_fffffffffffffda0),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar2 = ggml_cpu_has_vxe();
  if (iVar2 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(iVar1,iVar2),
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  iVar3 = ggml_cpu_has_wasm_simd();
  if (iVar3 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(iVar1,iVar2),(value_type *)CONCAT44(iVar3,in_stack_fffffffffffffd98));
  }
  iVar4 = ggml_cpu_has_llamafile();
  if (iVar4 != 0) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
              ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
               CONCAT44(iVar1,iVar2),(value_type *)CONCAT44(iVar3,iVar4));
  }
  std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
            ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
             CONCAT44(iVar1,iVar2),(value_type *)CONCAT44(iVar3,iVar4));
  std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::push_back
            ((vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)
             CONCAT44(iVar1,iVar2),(value_type *)CONCAT44(iVar3,iVar4));
  return in_RDI;
}

Assistant:

static ggml_backend_feature * ggml_backend_cpu_get_features(ggml_backend_reg_t reg) {
    static std::vector<ggml_backend_feature> features = []() {
        ggml_cpu_init();

        std::vector<ggml_backend_feature> features;
        if (ggml_cpu_has_sse3()) {
            features.push_back({ "SSE3", "1" });
        }
        if (ggml_cpu_has_ssse3()) {
            features.push_back({ "SSSE3", "1" });
        }
        if (ggml_cpu_has_avx()) {
            features.push_back({ "AVX", "1" });
        }
        if (ggml_cpu_has_avx_vnni()) {
            features.push_back({ "AVX_VNNI", "1" });
        }
        if (ggml_cpu_has_avx2()) {
            features.push_back({ "AVX2", "1" });
        }
        if (ggml_cpu_has_f16c()) {
            features.push_back({ "F16C", "1" });
        }
        if (ggml_cpu_has_fma()) {
            features.push_back({ "FMA", "1" });
        }
        if (ggml_cpu_has_bmi2()) {
            features.push_back({ "BMI2", "1" });
        }
        if (ggml_cpu_has_avx512()) {
            features.push_back({ "AVX512", "1" });
        }
        if (ggml_cpu_has_avx512_vbmi()) {
            features.push_back({ "AVX512_VBMI", "1" });
        }
        if (ggml_cpu_has_avx512_vnni()) {
            features.push_back({ "AVX512_VNNI", "1" });
        }
        if (ggml_cpu_has_avx512_bf16()) {
            features.push_back({ "AVX512_BF16", "1" });
        }
        if (ggml_cpu_has_amx_int8()) {
            features.push_back({ "AMX_INT8", "1" });
        }
        if (ggml_cpu_has_neon()) {
            features.push_back({ "NEON", "1" });
        }
        if (ggml_cpu_has_arm_fma()) {
            features.push_back({ "ARM_FMA", "1" });
        }
        if (ggml_cpu_has_fp16_va()) {
            features.push_back({ "FP16_VA", "1" });
        }
        if (ggml_cpu_has_matmul_int8()) {
            features.push_back({ "MATMUL_INT8", "1" });
        }
        if (ggml_cpu_has_sve()) {
            features.push_back({ "SVE", "1" });
        }
        if (ggml_cpu_has_dotprod()) {
            features.push_back({ "DOTPROD", "1" });
        }
        if (ggml_cpu_get_sve_cnt() > 0) {
            static std::string sve_cnt = std::to_string(ggml_cpu_get_sve_cnt());
            features.push_back({ "SVE_CNT", sve_cnt.c_str() });
        }
        if (ggml_cpu_has_sme()) {
            features.push_back({ "SME", "1" });
        }
        if (ggml_cpu_has_riscv_v()) {
            features.push_back({ "RISCV_V", "1" });
        }
        if (ggml_cpu_has_vsx()) {
            features.push_back({ "VSX", "1" });
        }
        if (ggml_cpu_has_vxe()) {
            features.push_back({ "VXE", "1" });
        }
        if (ggml_cpu_has_wasm_simd()) {
            features.push_back({ "WASM_SIMD", "1" });
        }
        if (ggml_cpu_has_llamafile()) {
            features.push_back({ "LLAMAFILE", "1" });
        }
    #ifdef GGML_USE_ACCELERATE
        features.push_back({ "ACCELERATE", "1" });
    #endif
    #ifdef GGML_USE_CPU_HBM
        features.push_back({ "CPU_HBM", "1" });
    #endif
    #ifdef GGML_USE_OPENMP
        features.push_back({ "OPENMP", "1" });
    #endif
    #ifdef GGML_USE_CPU_KLEIDIAI
        features.push_back({ "KLEIDIAI", "1" });
    #endif
    #ifdef GGML_USE_CPU_AARCH64
        features.push_back({ "AARCH64_REPACK", "1" });
    #endif

        features.push_back({ nullptr, nullptr });

        return features;
    }();

    return features.data();

    GGML_UNUSED(reg);
}